

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_open_test(player *p,loc_conflict grid)

{
  _Bool _Var1;
  player *p_local;
  loc_conflict grid_local;
  
  _Var1 = square_isknown((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = square_iscloseddoor((chunk *)cave,grid);
    if (_Var1) {
      grid_local.x._3_1_ = true;
    }
    else {
      msgt(0x1b,"You see nothing there to open.");
      _Var1 = square_iscloseddoor((chunk *)p->cave,grid);
      if (_Var1) {
        square_forget((chunk *)cave,grid);
        square_light_spot((chunk *)cave,(loc)grid);
      }
      grid_local.x._3_1_ = false;
    }
  }
  else {
    msg("You see nothing there.");
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_open_test(struct player *p, struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return false;
	}

	/* Must be a closed door */
	if (!square_iscloseddoor(cave, grid)) {
		msgt(MSG_NOTHING_TO_OPEN, "You see nothing there to open.");
		if (square_iscloseddoor(p->cave, grid)) {
			square_forget(cave, grid);
			square_light_spot(cave, grid);
		}
		return false;
	}

	return (true);
}